

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

optional<pbrt::QuadricIntersection> * __thiscall
pbrt::Cylinder::BasicIntersect
          (optional<pbrt::QuadricIntersection> *__return_storage_ptr__,Cylinder *this,Ray *r,
          Float tMax)

{
  bool bVar1;
  ulong uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Interval<float> i;
  Interval<float> args;
  float fVar7;
  float fVar8;
  float fVar9;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar10 [16];
  Interval<float> IVar11;
  Interval<float> IVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar29 [64];
  undefined1 auVar16 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar18 [16];
  undefined1 auVar32 [64];
  undefined1 auVar19 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar21 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  FloatInterval b;
  Vector3fi di;
  Point3fi oi;
  FloatInterval c;
  FloatInterval f;
  undefined1 local_128 [16];
  Interval<float> local_110;
  undefined1 local_108 [16];
  Point3fi local_f8;
  Point3fi local_d8;
  Vector3fi local_c0;
  undefined1 local_a8 [16];
  Interval<float> local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Interval<float> local_50;
  Interval<float> local_48;
  Interval<float> local_40;
  Interval<float> local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  
  local_a8._0_4_ = tMax;
  fVar8 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar17._4_4_ = fVar8;
  auVar17._0_4_ = fVar8;
  auVar17._8_4_ = fVar8;
  auVar17._12_4_ = fVar8;
  fVar8 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar16._4_4_ = fVar8;
  auVar16._0_4_ = fVar8;
  auVar16._8_4_ = fVar8;
  auVar16._12_4_ = fVar8;
  local_f8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  _0_16_ = vmovlhps_avx(auVar17,auVar16);
  fVar8 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar42._4_4_ = fVar8;
  auVar42._0_4_ = fVar8;
  auVar42._8_4_ = fVar8;
  auVar42._12_4_ = fVar8;
  local_f8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z
       = (Interval<float>)vmovlps_avx(auVar42);
  Transform::operator()(&local_d8,this->objectFromRender,&local_f8);
  fVar8 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar20._4_4_ = fVar8;
  auVar20._0_4_ = fVar8;
  auVar20._8_4_ = fVar8;
  auVar20._12_4_ = fVar8;
  fVar8 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar43._4_4_ = fVar8;
  auVar43._0_4_ = fVar8;
  auVar43._8_4_ = fVar8;
  auVar43._12_4_ = fVar8;
  local_c0.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  ._0_16_ = vmovlhps_avx(auVar20,auVar43);
  fVar8 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar44._4_4_ = fVar8;
  auVar44._0_4_ = fVar8;
  auVar44._8_4_ = fVar8;
  auVar44._12_4_ = fVar8;
  local_c0.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .z = (Interval<float>)vmovlps_avx(auVar44);
  Transform::operator()((Vector3fi *)&local_f8,this->objectFromRender,&local_c0);
  IVar11 = SumSquares<float,pbrt::Interval<float>>
                     (local_f8.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x,
                      local_f8.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y);
  local_108._8_8_ = extraout_XMM0_Qb;
  local_108._0_4_ = IVar11.low;
  local_108._4_4_ = IVar11.high;
  IVar11.high = local_d8.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  IVar11.low = local_d8.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar24._0_8_ = Interval<float>::operator*<float>((Interval<float> *)&local_f8,IVar11);
  auVar24._8_56_ = extraout_var_05;
  local_90 = (Interval<float>)vmovlps_avx(auVar24._0_16_);
  i.high = local_d8.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  i.low = local_d8.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  IVar11 = Interval<float>::operator*<float>
                     (&local_f8.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i);
  IVar12 = Interval<float>::operator+<float>(&local_90,IVar11);
  auVar45._8_4_ = 0x40000000;
  auVar45._0_8_ = 0x4000000040000000;
  auVar45._12_4_ = 0x40000000;
  IVar11 = (Interval<float>)vmovlps_avx(auVar45);
  local_c0.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .x = IVar11;
  auVar25._0_8_ = Interval<float>::operator*<float>((Interval<float> *)&local_c0,IVar12);
  auVar25._8_56_ = extraout_var_06;
  local_110 = (Interval<float>)vmovlps_avx(auVar25._0_16_);
  IVar12.high = local_d8.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  IVar12.low = local_d8.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  args.high = local_d8.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  args.low = local_d8.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar26._0_8_ = SumSquares<float,pbrt::Interval<float>>(IVar12,args);
  auVar26._8_56_ = extraout_var_07;
  local_c0.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .x = (Interval<float>)vmovlps_avx(auVar26._0_16_);
  fVar8 = this->radius;
  fVar7 = fVar8 * fVar8;
  auVar17 = ZEXT416((uint)fVar7);
  if ((fVar8 != 0.0) || (NAN(fVar8))) {
    uVar3 = vcmpss_avx512f(auVar17,ZEXT816(0) << 0x40,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar8 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar7);
    if (fVar7 < INFINITY) {
      uVar3 = vcmpss_avx512f(auVar17,ZEXT816(0),0);
      fVar7 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar7);
      auVar17 = ZEXT416((-(uint)(fVar7 < 0.0) | 1) + (int)fVar7);
    }
    auVar16 = ZEXT416((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
    auVar20 = vminss_avx(auVar17,auVar16);
    auVar17 = vmaxss_avx(auVar17,auVar16);
    auVar17 = vinsertps_avx(auVar20,auVar17,0x10);
    i_00 = auVar17._0_8_;
  }
  else {
    if (fVar7 < INFINITY) {
      uVar3 = vcmpss_avx512f(auVar17,ZEXT816(0) << 0x40,0);
      fVar7 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar7 + 1);
    }
    auVar13._4_4_ = fVar7;
    auVar13._0_4_ = fVar7;
    auVar13._8_4_ = fVar7;
    auVar13._12_4_ = fVar7;
    auVar17 = vpblendd_avx2(auVar13,ZEXT416(0) << 0x40,0xd);
    uVar2 = vcmpps_avx512vl(ZEXT416((uint)fVar7),auVar17,1);
    i_00.high = (float)((uint)((byte)(uVar2 >> 1) & 1) * (int)fVar7);
    i_00.low = (float)((uint)((byte)uVar2 & 1) * (int)fVar7);
  }
  auVar27._0_8_ = Interval<float>::operator-<float>((Interval<float> *)&local_c0,i_00);
  auVar27._8_56_ = extraout_var_08;
  local_90 = (Interval<float>)vmovlps_avx(auVar27._0_16_);
  auVar14._8_4_ = 0x40000000;
  auVar14._0_8_ = 0x4000000040000000;
  auVar14._12_4_ = 0x40000000;
  local_c0.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .x = (Interval<float>)vmovlps_avx(auVar14);
  IVar11 = Interval<float>::operator*<float>
                     ((Interval<float> *)&local_c0,(Interval<float>)local_108._0_8_);
  auVar28._0_8_ = Interval<float>::operator/<float>(&local_110,IVar11);
  auVar28._8_56_ = extraout_var_09;
  local_48 = (Interval<float>)vmovlps_avx(auVar28._0_16_);
  IVar11 = Interval<float>::operator*<float>
                     (&local_48,
                      local_f8.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x);
  IVar11 = Interval<float>::operator-<float>((Interval<float> *)&local_d8,IVar11);
  local_128._8_8_ = extraout_XMM0_Qb_00;
  local_128._0_4_ = IVar11.low;
  local_128._4_4_ = IVar11.high;
  IVar12 = Interval<float>::operator*<float>
                     (&local_48,
                      local_f8.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y);
  auVar29._0_8_ =
       Interval<float>::operator-<float>
                 (&local_d8.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,IVar12);
  auVar29._8_56_ = extraout_var_10;
  fVar7 = IVar11.low;
  auVar17 = vmovshdup_avx(local_128);
  fVar9 = auVar17._0_4_;
  auVar17 = vmaxss_avx(ZEXT416((uint)(fVar7 * fVar7)),ZEXT416((uint)(fVar9 * fVar9)));
  fVar8 = auVar17._0_4_;
  if ((0.0 < fVar7) || (fVar9 < 0.0)) {
    auVar20 = vminss_avx(ZEXT416((uint)(fVar9 * fVar9)),ZEXT416((uint)(fVar7 * fVar7)));
    uVar3 = vcmpss_avx512f(auVar20,ZEXT816(0) << 0x40,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar7 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * auVar20._0_4_);
    if (fVar8 < INFINITY) {
      uVar3 = vcmpss_avx512f(auVar17,ZEXT816(0),0);
      fVar8 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar8);
      auVar17 = ZEXT416((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
    }
    auVar16 = ZEXT416((int)fVar7 + -1 + (uint)(fVar7 <= 0.0) * 2);
    auVar20 = vminss_avx(auVar17,auVar16);
    auVar17 = vmaxss_avx(auVar17,auVar16);
    auVar10 = vinsertps_avx(auVar20,auVar17,0x10);
  }
  else {
    if (fVar8 < INFINITY) {
      uVar3 = vcmpss_avx512f(auVar17,ZEXT816(0) << 0x40,0);
      fVar8 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar8);
      fVar8 = (float)((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
    }
    auVar46._4_4_ = fVar8;
    auVar46._0_4_ = fVar8;
    auVar46._8_4_ = fVar8;
    auVar46._12_4_ = fVar8;
    auVar17 = vpblendd_avx2(auVar46,ZEXT416(0) << 0x40,0xd);
    uVar2 = vcmpps_avx512vl(ZEXT416((uint)fVar8),auVar17,1);
    auVar10._4_4_ = (uint)((byte)(uVar2 >> 1) & 1) * (int)fVar8;
    auVar10._0_4_ = (uint)((byte)uVar2 & 1) * (int)fVar8;
    auVar10._8_4_ = (uint)((byte)(uVar2 >> 2) & 1) * (int)fVar8;
    auVar10._12_4_ = (uint)((byte)(uVar2 >> 3) & 1) * (int)fVar8;
  }
  uVar3 = vmovlps_avx(auVar10);
  local_c0.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .x.low = (float)(int)uVar3;
  local_c0.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .x.high = (float)(int)((ulong)uVar3 >> 0x20);
  fVar7 = auVar29._0_4_;
  auVar17 = vmovshdup_avx(auVar29._0_16_);
  fVar9 = auVar17._0_4_;
  auVar17 = vmaxss_avx(ZEXT416((uint)(fVar7 * fVar7)),ZEXT416((uint)(fVar9 * fVar9)));
  fVar8 = auVar17._0_4_;
  if ((0.0 < fVar7) || (fVar9 < 0.0)) {
    auVar20 = vminss_avx(ZEXT416((uint)(fVar9 * fVar9)),ZEXT416((uint)(fVar7 * fVar7)));
    uVar3 = vcmpss_avx512f(auVar20,ZEXT816(0) << 0x40,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar7 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * auVar20._0_4_);
    if (fVar8 < INFINITY) {
      uVar3 = vcmpss_avx512f(auVar17,ZEXT816(0) << 0x40,0);
      fVar8 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar8);
      auVar17 = ZEXT416((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
    }
    auVar16 = ZEXT416((int)fVar7 + -1 + (uint)(fVar7 <= 0.0) * 2);
    auVar20 = vminss_avx(auVar17,auVar16);
    auVar17 = vmaxss_avx(auVar17,auVar16);
    auVar17 = vinsertps_avx(auVar20,auVar17,0x10);
    i_01 = auVar17._0_8_;
  }
  else {
    if (fVar8 < INFINITY) {
      uVar3 = vcmpss_avx512f(auVar17,ZEXT816(0) << 0x40,0);
      fVar8 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar8);
      fVar8 = (float)((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
    }
    auVar47._4_4_ = fVar8;
    auVar47._0_4_ = fVar8;
    auVar47._8_4_ = fVar8;
    auVar47._12_4_ = fVar8;
    auVar17 = vpblendd_avx2(auVar47,ZEXT816(0) << 0x40,0xd);
    auVar15._4_12_ = ZEXT812(0) << 0x20;
    auVar15._0_4_ = fVar8;
    uVar2 = vcmpps_avx512vl(auVar15,auVar17,1);
    i_01.high = (float)((uint)((byte)(uVar2 >> 1) & 1) * (int)fVar8);
    i_01.low = (float)((uint)((byte)uVar2 & 1) * (int)fVar8);
  }
  auVar30._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_c0,i_01);
  auVar30._8_56_ = extraout_var_11;
  auVar17 = auVar30._0_16_;
  if (auVar30._0_4_ < 0.0) {
    auVar31._0_4_ = sqrtf(auVar30._0_4_);
    auVar31._4_60_ = extraout_var;
    auVar20 = auVar31._0_16_;
  }
  else {
    auVar20 = vsqrtss_avx(auVar17,auVar17);
  }
  if (-INFINITY < auVar20._0_4_) {
    auVar18._0_12_ = ZEXT812(0);
    auVar18._12_4_ = 0;
    uVar3 = vcmpss_avx512f(auVar20,auVar18,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar8 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)auVar20._0_4_);
    auVar20 = ZEXT416((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
  }
  auVar17 = vmovshdup_avx(auVar17);
  if (auVar17._0_4_ < 0.0) {
    auVar32._0_4_ = sqrtf(auVar17._0_4_);
    auVar32._4_60_ = extraout_var_00;
    auVar17 = auVar32._0_16_;
  }
  else {
    auVar17 = vsqrtss_avx(auVar17,auVar17);
  }
  if (auVar17._0_4_ < INFINITY) {
    uVar3 = vcmpss_avx512f(auVar17,ZEXT816(0) << 0x40,0);
    fVar8 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)auVar17._0_4_);
    auVar17 = ZEXT416((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
  }
  auVar20 = vmaxss_avx(auVar20,ZEXT816(0) << 0x40);
  auVar16 = vminss_avx(auVar17,auVar20);
  auVar17 = vmaxss_avx(auVar17,auVar20);
  auVar17 = vinsertps_avx(auVar16,auVar17,0x10);
  auVar19._8_4_ = 0x40800000;
  auVar19._0_8_ = 0x4080000040800000;
  auVar19._12_4_ = 0x40800000;
  local_c0.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .x = (Interval<float>)vmovlps_avx(auVar19);
  auVar33._0_8_ =
       Interval<float>::operator*<float>
                 ((Interval<float> *)&local_c0,(Interval<float>)local_108._0_8_);
  auVar33._8_56_ = extraout_var_12;
  local_50 = (Interval<float>)vmovlps_avx(auVar33._0_16_);
  local_38.low = this->radius;
  local_128._0_8_ = auVar17._0_8_;
  local_38.high = local_38.low;
  IVar11 = Interval<float>::operator+<float>(&local_38,(Interval<float>)local_128._0_8_);
  auVar34._0_8_ = Interval<float>::operator*<float>(&local_50,IVar11);
  auVar34._8_56_ = extraout_var_13;
  uVar3 = vmovlps_avx(auVar34._0_16_);
  local_c0.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .x.low = (float)(int)uVar3;
  local_c0.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .x.high = (float)(int)((ulong)uVar3 >> 0x20);
  local_40.low = this->radius;
  local_40.high = local_40.low;
  IVar11 = Interval<float>::operator-<float>(&local_40,(Interval<float>)local_128._0_8_);
  auVar35._0_8_ = Interval<float>::operator*<float>((Interval<float> *)&local_c0,IVar11);
  auVar35._8_56_ = extraout_var_14;
  auVar17 = auVar35._0_16_;
  fVar8 = auVar35._0_4_;
  if (0.0 <= fVar8) {
    if (fVar8 < 0.0) {
      auVar36._0_4_ = sqrtf(fVar8);
      auVar36._4_60_ = extraout_var_01;
      auVar20 = auVar36._0_16_;
    }
    else {
      auVar20 = vsqrtss_avx(auVar17,auVar17);
    }
    if (-INFINITY < auVar20._0_4_) {
      auVar21._0_12_ = ZEXT812(0);
      auVar21._12_4_ = 0;
      uVar3 = vcmpss_avx512f(auVar20,auVar21,0);
      bVar4 = (bool)((byte)uVar3 & 1);
      fVar8 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)auVar20._0_4_);
      auVar20 = ZEXT416((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
    }
    auVar17 = vmovshdup_avx(auVar17);
    if (auVar17._0_4_ < 0.0) {
      auVar37._0_4_ = sqrtf(auVar17._0_4_);
      auVar37._4_60_ = extraout_var_02;
      auVar17 = auVar37._0_16_;
    }
    else {
      auVar17 = vsqrtss_avx(auVar17,auVar17);
    }
    if (auVar17._0_4_ < INFINITY) {
      uVar3 = vcmpss_avx512f(auVar17,ZEXT816(0) << 0x40,0);
      fVar8 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)auVar17._0_4_);
      auVar17 = ZEXT416((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
    }
    auVar20 = vmaxss_avx(auVar20,ZEXT816(0) << 0x40);
    auVar16 = vminss_avx(auVar17,auVar20);
    auVar17 = vmaxss_avx(auVar17,auVar20);
    auVar17 = vinsertps_avx(auVar16,auVar17,0x10);
    if (0.0 <= (local_110.low + local_110.high) * 0.5) {
      IVar11 = Interval<float>::operator+<float>(&local_110,auVar17._0_8_);
    }
    else {
      IVar11 = Interval<float>::operator-<float>(&local_110,auVar17._0_8_);
    }
    auVar48._8_4_ = 0xbf000000;
    auVar48._0_8_ = 0xbf000000bf000000;
    auVar48._12_4_ = 0xbf000000;
    local_c0.super_Vector3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x = (Interval<float>)vmovlps_avx(auVar48);
    auVar38._0_8_ = Interval<float>::operator*<float>((Interval<float> *)&local_c0,IVar11);
    auVar38._8_56_ = extraout_var_15;
    uVar3 = vmovlps_avx(auVar38._0_16_);
    local_c0.super_Vector3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x.low = (float)(int)uVar3;
    local_c0.super_Vector3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x.high = (float)(int)((ulong)uVar3 >> 0x20);
    IVar11 = Interval<float>::operator/<float>
                       ((Interval<float> *)&local_c0,(Interval<float>)local_108._0_8_);
    local_108._8_8_ = extraout_XMM0_Qb_01;
    local_108._0_4_ = IVar11.low;
    local_108._4_4_ = IVar11.high;
    auVar39._0_8_ =
         Interval<float>::operator/<float>
                   (&local_90,
                    local_c0.super_Vector3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x);
    auVar39._8_56_ = extraout_var_16;
    auVar17 = auVar39._0_16_;
    local_78 = local_108;
    if (local_108._0_4_ <= auVar39._0_4_) {
      local_78 = auVar17;
      auVar17 = local_108;
    }
    local_68 = vmovshdup_avx(auVar17);
    if ((((float)local_a8._0_4_ < local_68._0_4_) || (local_78._0_4_ <= 0.0)) ||
       ((auVar17._0_4_ <= 0.0 &&
        (local_68 = vmovshdup_avx(local_78), auVar17 = local_78,
        (float)local_a8._0_4_ < local_68._0_4_)))) goto LAB_002a1935;
    auVar5._4_4_ = local_d8.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar5._0_4_ = local_d8.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    auVar5._8_4_ = local_d8.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    auVar5._12_4_ =
         local_d8.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    fVar7 = (auVar17._0_4_ + local_68._0_4_) * 0.5;
    fVar8 = (local_d8.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
            local_d8.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 +
            fVar7 * (local_f8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
                    local_f8.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
    auVar20 = vinsertps_avx(auVar5,ZEXT416((uint)local_d8.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 y.high),0x10);
    auVar16 = vinsertps_avx((undefined1  [16])
                            local_f8.super_Point3<pbrt::Interval<float>_>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_,
                            ZEXT416((uint)local_f8.super_Point3<pbrt::Interval<float>_>.
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high)
                            ,0x10);
    local_88._0_4_ =
         (local_d8.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar20._0_4_) * 0.5 +
         fVar7 * (local_f8.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar16._0_4_) * 0.5;
    local_88._4_4_ =
         (local_d8.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar20._4_4_) * 0.5 +
         fVar7 * (local_f8.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar16._4_4_) * 0.5;
    local_88._8_4_ = (auVar20._8_4_ + 0.0) * 0.5 + fVar7 * (auVar16._8_4_ + 0.0) * 0.5;
    local_88._12_4_ = (auVar20._12_4_ + 0.0) * 0.5 + fVar7 * (auVar16._12_4_ + 0.0) * 0.5;
    auVar22._0_4_ = local_88._0_4_ * local_88._0_4_;
    auVar22._4_4_ = local_88._4_4_ * local_88._4_4_;
    auVar22._8_4_ = local_88._8_4_ * local_88._8_4_;
    auVar22._12_4_ = local_88._12_4_ * local_88._12_4_;
    auVar20 = vmovshdup_avx(auVar22);
    auVar20 = vfmadd231ss_fma(auVar20,local_88,local_88);
    local_108 = auVar17;
    if (auVar20._0_4_ < 0.0) {
      fVar7 = sqrtf(auVar20._0_4_);
    }
    else {
      auVar17 = vsqrtss_avx(auVar20,auVar20);
      fVar7 = auVar17._0_4_;
    }
    fVar7 = this->radius / fVar7;
    auVar49._0_4_ = local_88._0_4_ * fVar7;
    auVar49._4_4_ = local_88._4_4_ * fVar7;
    auVar49._8_4_ = local_88._8_4_ * fVar7;
    auVar49._12_4_ = local_88._12_4_ * fVar7;
    auVar17 = vmovshdup_avx(auVar49);
    local_88 = auVar49;
    auVar40._0_4_ = atan2f(auVar17._0_4_,auVar49._0_4_);
    auVar40._4_60_ = extraout_var_03;
    if ((this->zMin <= fVar8) && (fVar8 <= this->zMax)) {
      uVar3 = vcmpss_avx512f(auVar40._0_16_,ZEXT416(0),1);
      bVar4 = (bool)((byte)uVar3 & 1);
      fVar9 = (float)((uint)bVar4 * (int)(auVar40._0_4_ + 6.2831855) +
                     (uint)!bVar4 * (int)auVar40._0_4_);
      fVar7 = (float)local_108._0_4_;
      if (fVar9 <= this->phiMax) goto LAB_002a18d0;
    }
    fVar8 = local_78._0_4_;
    bVar4 = NAN((float)local_108._0_4_);
    bVar1 = (float)local_108._0_4_ == fVar8;
    local_108 = vmovshdup_avx(local_78);
    fVar7 = local_108._0_4_;
    if ((bVar1) && (!bVar4 && !NAN(fVar8))) {
      if (((float)local_68._0_4_ == fVar7) && (!NAN((float)local_68._0_4_) && !NAN(fVar7)))
      goto LAB_002a1935;
    }
    if (fVar7 <= (float)local_a8._0_4_) {
      auVar6._4_4_ = local_d8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar6._0_4_ = local_d8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
      auVar6._8_4_ = local_d8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
      auVar6._12_4_ =
           local_d8.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      fVar7 = (fVar8 + fVar7) * 0.5;
      fVar8 = (local_d8.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
              local_d8.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 +
              fVar7 * (local_f8.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
                      local_f8.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
      auVar17 = vinsertps_avx(auVar6,ZEXT416((uint)local_d8.super_Point3<pbrt::Interval<float>_>.
                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.high),0x10);
      auVar20 = vinsertps_avx((undefined1  [16])
                              local_f8.super_Point3<pbrt::Interval<float>_>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_,
                              ZEXT416((uint)local_f8.super_Point3<pbrt::Interval<float>_>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                            high),0x10);
      auVar50._0_4_ =
           (local_d8.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar17._0_4_) * 0.5 +
           fVar7 * (local_f8.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar20._0_4_) * 0.5
      ;
      auVar50._4_4_ =
           (local_d8.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar17._4_4_) * 0.5 +
           fVar7 * (local_f8.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar20._4_4_) * 0.5;
      auVar50._8_4_ = (auVar17._8_4_ + 0.0) * 0.5 + fVar7 * (auVar20._8_4_ + 0.0) * 0.5;
      auVar50._12_4_ = (auVar17._12_4_ + 0.0) * 0.5 + fVar7 * (auVar20._12_4_ + 0.0) * 0.5;
      auVar23._0_4_ = auVar50._0_4_ * auVar50._0_4_;
      auVar23._4_4_ = auVar50._4_4_ * auVar50._4_4_;
      auVar23._8_4_ = auVar50._8_4_ * auVar50._8_4_;
      auVar23._12_4_ = auVar50._12_4_ * auVar50._12_4_;
      auVar17 = vmovshdup_avx(auVar23);
      auVar17 = vfmadd231ss_fma(auVar17,auVar50,auVar50);
      if (auVar17._0_4_ < 0.0) {
        local_a8 = auVar50;
        fVar7 = sqrtf(auVar17._0_4_);
        auVar50 = local_a8;
      }
      else {
        auVar17 = vsqrtss_avx(auVar17,auVar17);
        fVar7 = auVar17._0_4_;
      }
      fVar7 = this->radius / fVar7;
      local_88._0_4_ = auVar50._0_4_ * fVar7;
      local_88._4_4_ = auVar50._4_4_ * fVar7;
      local_88._8_4_ = auVar50._8_4_ * fVar7;
      local_88._12_4_ = auVar50._12_4_ * fVar7;
      auVar17 = vmovshdup_avx(local_88);
      auVar41._0_4_ = atan2f(auVar17._0_4_,local_88._0_4_);
      auVar41._4_60_ = extraout_var_04;
      if ((this->zMin <= fVar8) && (fVar8 <= this->zMax)) {
        uVar3 = vcmpss_avx512f(auVar41._0_16_,ZEXT416(0),1);
        bVar4 = (bool)((byte)uVar3 & 1);
        fVar9 = (float)((uint)bVar4 * (int)(auVar41._0_4_ + 6.2831855) +
                       (uint)!bVar4 * (int)auVar41._0_4_);
        if (fVar9 <= this->phiMax) {
          fVar7 = (float)local_78._0_4_;
          local_68._0_4_ = local_108._0_4_;
LAB_002a18d0:
          __return_storage_ptr__->set = true;
          *(float *)&__return_storage_ptr__->optionalValue = (fVar7 + (float)local_68._0_4_) * 0.5;
          uVar3 = vmovlps_avx(local_88);
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 4) = uVar3;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = fVar8;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x10) = fVar9;
          return __return_storage_ptr__;
        }
      }
    }
  }
LAB_002a1935:
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<QuadricIntersection> BasicIntersect(const Ray &r, Float tMax) const {
        Float phi;
        Point3f pHit;
        // Transform _Ray_ origin and direction to object space
        Point3fi oi = (*objectFromRender)(Point3fi(r.o));
        Vector3fi di = (*objectFromRender)(Vector3fi(r.d));

        // Solve quadratic equation to find cylinder _t0_ and _t1_ values
        FloatInterval t0, t1;
        // Compute cylinder quadratic coefficients
        FloatInterval a = SumSquares(di.x, di.y);
        FloatInterval b = 2 * (di.x * oi.x + di.y * oi.y);
        FloatInterval c = SumSquares(oi.x, oi.y) - Sqr(FloatInterval(radius));

        // Compute cylinder quadratic discriminant _discrim_
        FloatInterval f = b / (2 * a);
        FloatInterval fx = oi.x - f * di.x, fy = oi.y - f * di.y;
        FloatInterval sqrtf = Sqrt(Sqr(fx) + Sqr(fy));
        FloatInterval discrim =
            4 * a * (FloatInterval(radius) + sqrtf) * (FloatInterval(radius) - sqrtf);
        if (discrim.LowerBound() < 0)
            return {};

        // Compute quadratic $t$ values
        FloatInterval rootDiscrim = Sqrt(discrim);
        FloatInterval q;
        if ((Float)b < 0)
            q = -.5f * (b - rootDiscrim);
        else
            q = -.5f * (b + rootDiscrim);
        t0 = q / a;
        t1 = c / q;
        // Swap quadratic $t$ values so that _t0_ is the lesser
        if (t0.LowerBound() > t1.LowerBound())
            pstd::swap(t0, t1);

        // Check quadric shape _t0_ and _t1_ for nearest intersection
        if (t0.UpperBound() > tMax || t1.LowerBound() <= 0)
            return {};
        FloatInterval tShapeHit = t0;
        if (tShapeHit.LowerBound() <= 0) {
            tShapeHit = t1;
            if (tShapeHit.UpperBound() > tMax)
                return {};
        }

        // Compute cylinder hit point and $\phi$
        pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
        // Refine cylinder intersection point
        Float hitRad = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
        pHit.x *= radius / hitRad;
        pHit.y *= radius / hitRad;

        phi = std::atan2(pHit.y, pHit.x);
        if (phi < 0)
            phi += 2 * Pi;

        // Test cylinder intersection against clipping parameters
        if (pHit.z < zMin || pHit.z > zMax || phi > phiMax) {
            if (tShapeHit == t1)
                return {};
            tShapeHit = t1;
            if (t1.UpperBound() > tMax)
                return {};
            // Compute cylinder hit point and $\phi$
            pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
            // Refine cylinder intersection point
            Float hitRad = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
            pHit.x *= radius / hitRad;
            pHit.y *= radius / hitRad;

            phi = std::atan2(pHit.y, pHit.x);
            if (phi < 0)
                phi += 2 * Pi;

            if (pHit.z < zMin || pHit.z > zMax || phi > phiMax)
                return {};
        }

        // Return _QuadricIntersection_ for cylinder intersection
        return QuadricIntersection{(Float)tShapeHit, pHit, phi};
    }